

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O3

zip_source_t * source_hole_create(char *fname,int flags,zip_error_t *error)

{
  void *__ptr;
  char *pcVar1;
  buffer_t *buffer;
  FILE *__stream;
  size_t sVar2;
  zip_uint8_t **ppzVar3;
  zip_source_t *pzVar4;
  zip_uint8_t *pzVar5;
  int *piVar6;
  zip_uint8_t ***pppzVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  ulong local_4c;
  ulong local_38;
  
  __ptr = malloc(0x28);
  if (__ptr != (void *)0x0) {
    pcVar1 = strdup(fname);
    *(char **)((long)__ptr + 0x10) = pcVar1;
    if (pcVar1 != (char *)0x0) {
      buffer = (buffer_t *)malloc(0x28);
      if (buffer == (buffer_t *)0x0) {
        zip_error_set(error,0xe,0);
      }
      else {
        buffer->fragment = (zip_uint8_t **)0x0;
        buffer->nfragments = 0;
        buffer->fragment_size = 0x2000;
        buffer->size = 0;
        buffer->offset = 0;
        if ((flags & 8U) != 0) {
LAB_00102938:
          *(buffer_t **)((long)__ptr + 0x18) = buffer;
          zip_error_init(__ptr);
          *(undefined8 *)((long)__ptr + 0x20) = 0;
          pzVar4 = (zip_source_t *)zip_source_function_create(source_hole_cb,__ptr,error);
          return pzVar4;
        }
        __stream = fopen(fname,"rb");
        if (__stream == (FILE *)0x0) {
          piVar6 = __errno_location();
          if (((flags & 1U) != 0) && (*piVar6 == 2)) goto LAB_00102938;
          buffer_free(buffer);
        }
        else {
          sVar2 = fread(&local_58,0x14,1,__stream);
          if (sVar2 == 1) {
            if (local_58 == 0x3048694e) {
              uVar12 = (ulong)(uStack_50 >> 0x18) | (((ulong)uStack_50 & 0xff0000) << 0x20) >> 0x28
                       | (((ulong)uStack_50 & 0xff00) << 0x20) >> 0x18 |
                       (((ulong)uStack_50 & 0xff) << 0x20) >> 8 |
                       ((ulong)uStack_54 & 0xff000000) << 8 | ((ulong)uStack_54 & 0xff0000) << 0x18
                       | ((ulong)uStack_54 & 0xff00) << 0x28 | CONCAT44(uStack_50,uStack_54) << 0x38
              ;
              buffer->fragment_size = uVar12;
              uVar9 = local_4c >> 0x38 | (local_4c & 0xff000000000000) >> 0x28 |
                      (local_4c & 0xff0000000000) >> 0x18 | (local_4c & 0xff00000000) >> 8 |
                      (local_4c & 0xff000000) << 8 | (local_4c & 0xff0000) << 0x18 |
                      (local_4c & 0xff00) << 0x28 | local_4c << 0x38;
              buffer->size = uVar9;
              if (!CARRY8(uVar9,uVar12)) {
                uVar10 = (uVar9 + uVar12) - 1;
                uVar9 = uVar10 / uVar12;
                buffer->nfragments = uVar9;
                if (uVar9 >> 0x3d == 0) {
                  pppzVar7 = &buffer->fragment;
                  local_38 = uVar9;
                  ppzVar3 = (zip_uint8_t **)malloc(uVar9 * 8);
                  *pppzVar7 = ppzVar3;
                  if (ppzVar3 != (zip_uint8_t **)0x0) {
                    if (uVar12 <= uVar10) {
                      uVar9 = 0;
                      do {
                        (*pppzVar7)[uVar9] = (zip_uint8_t *)0x0;
                        uVar9 = uVar9 + 1;
                      } while (uVar9 < local_38);
                      uVar9 = 0;
                      do {
                        sVar2 = fread(&local_58,4,1,__stream);
                        if (sVar2 != 1) goto LAB_00102a4d;
                        if (local_58 == 0x3248694e) {
                          sVar2 = fread(&local_58,8,1,__stream);
                          if (sVar2 != 1) goto LAB_00102a4d;
                          uVar9 = uVar9 + ((ulong)(uStack_54 >> 0x18) |
                                           (((ulong)uStack_54 & 0xff0000) << 0x20) >> 0x28 |
                                           (((ulong)uStack_54 & 0xff00) << 0x20) >> 0x18 |
                                           (((ulong)uStack_54 & 0xff) << 0x20) >> 8 |
                                           ((ulong)local_58 & 0xff000000) << 8 |
                                           ((ulong)local_58 & 0xff0000) << 0x18 |
                                           ((ulong)local_58 & 0xff00) << 0x28 |
                                          CONCAT44(uStack_54,local_58) << 0x38);
                        }
                        else {
                          if (local_58 != 0x3148694e) goto LAB_00102a5e;
                          sVar2 = buffer->fragment_size;
                          pzVar5 = (zip_uint8_t *)malloc(sVar2);
                          buffer->fragment[uVar9] = pzVar5;
                          if (pzVar5 == (zip_uint8_t *)0x0) goto LAB_00102a6d;
                          sVar2 = fread((*pppzVar7)[uVar9],sVar2,1,__stream);
                          if (sVar2 != 1) goto LAB_00102a4d;
                          uVar9 = uVar9 + 1;
                        }
                      } while (uVar9 < buffer->nfragments);
                    }
                    fclose(__stream);
                    goto LAB_00102938;
                  }
                }
              }
LAB_00102a6d:
              uVar11 = 0xe;
              iVar8 = 0;
            }
            else {
LAB_00102a5e:
              uVar11 = 5;
              iVar8 = 0x16;
            }
          }
          else {
LAB_00102a4d:
            piVar6 = __errno_location();
            iVar8 = *piVar6;
            uVar11 = 5;
          }
          zip_error_set(error,uVar11,iVar8);
          buffer_free(buffer);
          fclose(__stream);
        }
      }
      free(__ptr);
      return (zip_source_t *)0x0;
    }
    free(__ptr);
  }
  zip_error_set(error,0xe,0);
  return (zip_source_t *)0x0;
}

Assistant:

zip_source_t *
source_hole_create(const char *fname, int flags, zip_error_t *error) {
    hole_t *ud = hole_new(fname, flags, error);

    if (ud == NULL) {
	return NULL;
    }
    return zip_source_function_create(source_hole_cb, ud, error);
}